

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCmp<(moira::Instr)37,(moira::Mode)8,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  StrWriter *pSVar6;
  char *pcVar7;
  char cVar8;
  Ea<(moira::Mode)8,_(moira::Size)1> src;
  Ea<(moira::Mode)8,_(moira::Size)1> local_3c;
  
  local_3c.reg = op & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  iVar4 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = uVar5 & 0xffff | iVar4 << 0x10;
  bVar3 = str->upper;
  pcVar7 = "cmp";
  if ((bool)bVar3 != false) {
    pcVar7 = "CMP";
  }
  cVar8 = *pcVar7;
  if (cVar8 != '\0') {
    do {
      pcVar7 = pcVar7 + 1;
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar8;
      cVar8 = *pcVar7;
    } while (cVar8 != '\0');
    bVar3 = str->upper;
  }
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = '.';
  pbVar2 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (~bVar3 & 1) << 5 | 0x42;
  iVar4 = (this->tab).raw;
  while (pcVar7 = str->ptr, pcVar7 < str->base + iVar4) {
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  pSVar6 = StrWriter::operator<<(str,&local_3c);
  pcVar7 = pSVar6->ptr;
  pSVar6->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  pcVar7 = pSVar6->ptr;
  pSVar6->ptr = pcVar7 + 1;
  *pcVar7 = ' ';
  pcVar7 = pSVar6->ptr;
  pSVar6->ptr = pcVar7 + 1;
  *pcVar7 = 'D';
  pbVar2 = (byte *)pSVar6->ptr;
  pSVar6->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmCmp(StrWriter &str, u32 &addr, u16 op)
{
    Ea<M,S> src = Op <M,S> ( _____________xxx(op), addr );
    Dn      dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}